

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

double ON_SubDEdgeSharpness::Sanitize(double sharpness,double invalid_input_result)

{
  double dVar1;
  
  if ((((0.0 <= sharpness) && (sharpness <= 4.0)) &&
      (dVar1 = floor(sharpness), invalid_input_result = sharpness, 0.0 <= dVar1)) &&
     (((dVar1 <= 4.0 && (invalid_input_result = dVar1, 0.01 < sharpness - dVar1)) &&
      ((dVar1 = dVar1 + 1.0, invalid_input_result = sharpness, dVar1 - sharpness <= 0.01 &&
       (invalid_input_result = sharpness, dVar1 <= 4.0)))))) {
    invalid_input_result = dVar1;
  }
  return invalid_input_result;
}

Assistant:

double ON_SubDEdgeSharpness::Sanitize(
  double sharpness, 
  double invalid_input_result
)
{
  // When sharpness is withing ON_SubDEdgeSharpness::Tolerance of an integer value,
  // snap to that integer value.

  if (false == (sharpness >= 0.0 && sharpness <= ON_SubDEdgeSharpness::MaximumValue))
    return invalid_input_result; // when sharpness is nan, invalid_input_result is returned here. 

  // When sharpness is close to an integer value, snap to the integer value.
  // This results in cleaner looking limit surfaces and faster evaluation.
  const double f = floor(sharpness);
  if (f >= 0.0 && f <= ON_SubDEdgeSharpness::MaximumValue)
  {
    if (sharpness - f <= ON_SubDEdgeSharpness::Tolerance)
      sharpness = f;
    else if (f + 1.0 - sharpness <= ON_SubDEdgeSharpness::Tolerance && f + 1.0 <= ON_SubDEdgeSharpness::MaximumValue)
      sharpness = f + 1.0;
  }

  return sharpness;
}